

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  uint uVar1;
  Op OVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  mapped_type *this_00;
  bool bVar5;
  uint32_t local_3c;
  Instruction *pIStack_38;
  uint32_t member_idx;
  Instruction *type_inst;
  uint32_t i;
  uint32_t type_id;
  Instruction *composite_inst;
  uint32_t composite_id;
  uint32_t first_operand;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  _composite_id = inst;
  inst_local = (Instruction *)this;
  OVar2 = opt::Instruction::opcode(inst);
  bVar5 = true;
  if (OVar2 != OpCompositeExtract) {
    OVar2 = opt::Instruction::opcode(_composite_id);
    bVar5 = false;
    if (OVar2 == OpSpecConstantOp) {
      uVar3 = opt::Instruction::GetSingleWordInOperand(_composite_id,0);
      bVar5 = uVar3 == 0x51;
    }
  }
  if (!bVar5) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeExtract)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0xbc,
                  "void spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract(const Instruction *)"
                 );
  }
  OVar2 = opt::Instruction::opcode(_composite_id);
  composite_inst._4_4_ = (uint)(OVar2 == OpSpecConstantOp);
  composite_inst._0_4_ =
       opt::Instruction::GetSingleWordInOperand(_composite_id,composite_inst._4_4_);
  pDVar4 = Pass::get_def_use_mgr((Pass *)this);
  _i = analysis::DefUseManager::GetDef(pDVar4,(uint32_t)composite_inst);
  type_inst._4_4_ = opt::Instruction::type_id(_i);
  type_inst._0_4_ = composite_inst._4_4_;
  do {
    while( true ) {
      type_inst._0_4_ = (uint)type_inst + 1;
      uVar1 = (uint)type_inst;
      uVar3 = opt::Instruction::NumInOperands(_composite_id);
      if (uVar3 <= uVar1) {
        return;
      }
      pDVar4 = Pass::get_def_use_mgr((Pass *)this);
      pIStack_38 = analysis::DefUseManager::GetDef(pDVar4,type_inst._4_4_);
      local_3c = opt::Instruction::GetSingleWordInOperand(_composite_id,(uint)type_inst);
      OVar2 = opt::Instruction::opcode(pIStack_38);
      if ((1 < OVar2 - OpTypeVector) && (1 < OVar2 - OpTypeArray)) break;
LAB_009b63ed:
      type_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIStack_38,0);
    }
    if (OVar2 != OpTypeStruct) {
      if (((OVar2 != OpTypeCooperativeMatrixKHR) && (OVar2 != OpTypeCooperativeVectorNV)) &&
         (OVar2 != OpTypeCooperativeMatrixNV)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0xd6,
                      "void spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract(const Instruction *)"
                     );
      }
      goto LAB_009b63ed;
    }
    this_00 = std::
              unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->used_members_,(key_type *)((long)&type_inst + 4));
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (this_00,&local_3c);
    type_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIStack_38,local_3c);
  } while( true );
}

Assistant:

void EliminateDeadMembersPass::MarkMembersAsLiveForExtract(
    const Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeExtract));

  uint32_t first_operand =
      (inst->opcode() == spv::Op::OpSpecConstantOp ? 1 : 0);
  uint32_t composite_id = inst->GetSingleWordInOperand(first_operand);
  Instruction* composite_inst = get_def_use_mgr()->GetDef(composite_id);
  uint32_t type_id = composite_inst->type_id();

  for (uint32_t i = first_operand + 1; i < inst->NumInOperands(); ++i) {
    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        used_members_[type_id].insert(member_idx);
        type_id = type_inst->GetSingleWordInOperand(member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }
}